

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_path(void)

{
  int iVar1;
  VALUE *pVVar2;
  VALUE *pVVar3;
  VALUE *pVVar4;
  VALUE *root_00;
  VALUE *path;
  VALUE *pVVar5;
  VALUE *bar2;
  VALUE *bar1;
  VALUE *bar0;
  VALUE *bar;
  VALUE *foo;
  VALUE root;
  VALUE *in_stack_ffffffffffffffc8;
  VALUE *in_stack_ffffffffffffffd0;
  VALUE *in_stack_ffffffffffffffd8;
  VALUE *in_stack_ffffffffffffffe0;
  VALUE local_10;
  
  iVar1 = value_init_dict((VALUE *)0x10cb8e);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3d7,"%s","value_init_dict(&root) == 0");
  pVVar2 = value_dict_get_or_add(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8);
  iVar1 = value_init_dict((VALUE *)0x10cbde);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3d9,"%s","value_init_dict(foo) == 0");
  pVVar3 = value_dict_get_or_add(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8);
  iVar1 = value_init_array(in_stack_ffffffffffffffc8);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3db,"%s","value_init_array(bar) == 0");
  pVVar4 = value_array_append(in_stack_ffffffffffffffd0);
  acutest_check_((int)(ulong)(pVVar4 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3dc,"%s","value_array_append(bar) != NULL");
  pVVar4 = value_array_append(in_stack_ffffffffffffffd0);
  acutest_check_((int)(ulong)(pVVar4 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3dd,"%s","value_array_append(bar) != NULL");
  pVVar4 = value_array_append(in_stack_ffffffffffffffd0);
  acutest_check_((int)(ulong)(pVVar4 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3de,"%s","value_array_append(bar) != NULL");
  pVVar4 = value_array_get(in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  root_00 = value_array_get(pVVar4,(size_t)in_stack_ffffffffffffffd0);
  path = value_array_get(pVVar4,(size_t)root_00);
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e3,"%s","value_path(NULL, \"\") == NULL");
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e4,"%s","value_path(NULL, \"foo\") == NULL");
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == &local_10),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e5,"%s","value_path(&root, \"\") == &root");
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == &local_10),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e6,"%s","value_path(&root, \"/\") == &root");
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == &local_10),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,999,"%s","value_path(&root, \"////\") == &root");
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == pVVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,1000,"%s","value_path(&root, \"foo\") == foo");
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == pVVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e9,"%s","value_path(&root, \"/foo\") == foo");
  pVVar5 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar5 == pVVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ea,"%s","value_path(&root, \"/foo/\") == foo");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3eb,"%s","value_path(&root, \"foo/bar\") == bar");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ec,"%s","value_path(&root, \"//foo///bar///\") == bar");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ed,"%s","value_path(&root, \"/foo/bar/\") == bar");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ee,"%s","value_path(&root, \"/foo/bar/[0]\") == bar0");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == root_00),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ef,"%s","value_path(&root, \"/foo/bar/[1]\") == bar1");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == path),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f0,"%s","value_path(&root, \"/foo/bar/[2]\") == bar2");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f1,"%s","value_path(&root, \"/foo/bar/[3]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f2,"%s","value_path(&root, \"/foo/bar/[-0]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == path),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f3,"%s","value_path(&root, \"/foo/bar/[-1]\") == bar2");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == root_00),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f4,"%s","value_path(&root, \"/foo/bar/[-2]\") == bar1");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f5,"%s","value_path(&root, \"/foo/bar/[-3]\") == bar0");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f6,"%s","value_path(&root, \"/foo/bar/[]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f7,"%s","value_path(&root, \"/foo/bar/[x]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f8,"%s","value_path(&root, \"/foo/bar/0\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f9,"%s","value_path(&root, \"/foo/bar[0]\") == bar0");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == root_00),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fa,"%s","value_path(&root, \"/foo/bar[1]\") == bar1");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == path),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fb,"%s","value_path(&root, \"/foo/bar[2]\") == bar2");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fc,"%s","value_path(&root, \"/foo/bar[3]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fd,"%s","value_path(&root, \"/foo/bar[-0]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == path),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fe,"%s","value_path(&root, \"/foo/bar[-1]\") == bar2");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == root_00),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ff,"%s","value_path(&root, \"/foo/bar[-2]\") == bar1");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x400,"%s","value_path(&root, \"/foo/bar[-3]\") == bar0");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x401,"%s","value_path(&root, \"/foo/bar[]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x402,"%s","value_path(&root, \"/foo/bar[x]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x403,"%s","value_path(&root, \"/foo/bar0\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x404,"%s","value_path(&root, \"/[0]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x405,"%s","value_path(&root, \"[0]\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x406,"%s","value_path(&root, \"xxx/yyy\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x407,"%s","value_path(&root, \"foo/yyy\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x408,"%s","value_path(&root, \"xxx/foo\") == NULL");
  pVVar2 = value_path(root_00,(char *)path);
  acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x409,"%s","value_path(&root, \"xxx/bar\") == NULL");
  value_fini((VALUE *)0x10d779);
  return;
}

Assistant:

static void
test_path(void)
{
    VALUE root;
    VALUE* foo;
    VALUE* bar;
    VALUE* bar0;
    VALUE* bar1;
    VALUE* bar2;

    TEST_CHECK(value_init_dict(&root) == 0);
    foo = value_dict_get_or_add(&root, "foo");
    TEST_CHECK(value_init_dict(foo) == 0);
    bar = value_dict_get_or_add(foo, "bar");
    TEST_CHECK(value_init_array(bar) == 0);
    TEST_CHECK(value_array_append(bar) != NULL);
    TEST_CHECK(value_array_append(bar) != NULL);
    TEST_CHECK(value_array_append(bar) != NULL);
    bar0 = value_array_get(bar, 0);
    bar1 = value_array_get(bar, 1);
    bar2 = value_array_get(bar, 2);

    TEST_CHECK(value_path(NULL, "") == NULL);
    TEST_CHECK(value_path(NULL, "foo") == NULL);
    TEST_CHECK(value_path(&root, "") == &root);
    TEST_CHECK(value_path(&root, "/") == &root);
    TEST_CHECK(value_path(&root, "////") == &root);
    TEST_CHECK(value_path(&root, "foo") == foo);
    TEST_CHECK(value_path(&root, "/foo") == foo);
    TEST_CHECK(value_path(&root, "/foo/") == foo);
    TEST_CHECK(value_path(&root, "foo/bar") == bar);
    TEST_CHECK(value_path(&root, "//foo///bar///") == bar);
    TEST_CHECK(value_path(&root, "/foo/bar/") == bar);
    TEST_CHECK(value_path(&root, "/foo/bar/[0]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar/[1]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar/[2]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar/[3]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/[-0]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/[-1]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar/[-2]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar/[-3]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar/[]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/[x]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/0") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[0]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar[1]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar[2]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar[3]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[-0]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[-1]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar[-2]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar[-3]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar[]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[x]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar0") == NULL);
    TEST_CHECK(value_path(&root, "/[0]") == NULL);
    TEST_CHECK(value_path(&root, "[0]") == NULL);
    TEST_CHECK(value_path(&root, "xxx/yyy") == NULL);
    TEST_CHECK(value_path(&root, "foo/yyy") == NULL);
    TEST_CHECK(value_path(&root, "xxx/foo") == NULL);
    TEST_CHECK(value_path(&root, "xxx/bar") == NULL);

    value_fini(&root);
}